

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraHot.c
# Opt level: O1

Aig_Man_t * Fra_OneHotCreateExdc(Fra_Man_t *p,Vec_Int_t *vOneHots)

{
  uint uVar1;
  uint uVar2;
  void **ppvVar3;
  int iVar4;
  uint uVar5;
  Aig_Man_t *p_00;
  Aig_Obj_t *pDriver;
  Aig_Man_t *pAVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  
  p_00 = Aig_ManStart(vOneHots->nSize / 2);
  pAVar6 = p->pManAig;
  if (0 < pAVar6->vCis->nSize) {
    iVar7 = 0;
    do {
      Aig_ObjCreateCi(p_00);
      iVar7 = iVar7 + 1;
      pAVar6 = p->pManAig;
    } while (iVar7 < pAVar6->vCis->nSize);
  }
  iVar7 = vOneHots->nSize;
  if (0 < iVar7) {
    iVar8 = pAVar6->nObjs[2] - pAVar6->nRegs;
    lVar10 = 1;
    do {
      if (iVar7 <= lVar10) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar1 = vOneHots->pArray[lVar10 + -1];
      uVar2 = vOneHots->pArray[lVar10];
      if (uVar1 != 0 || uVar2 != 0) {
        uVar5 = ~uVar1;
        if (0 < (int)uVar1) {
          uVar5 = uVar1 - 1;
        }
        uVar5 = uVar5 + iVar8;
        if ((int)uVar5 < 0) {
LAB_009041d1:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        iVar7 = p_00->vCis->nSize;
        if (iVar7 <= (int)uVar5) goto LAB_009041d1;
        uVar9 = ~uVar2;
        if (0 < (int)uVar2) {
          uVar9 = uVar2 - 1;
        }
        uVar9 = uVar9 + iVar8;
        if (((int)uVar9 < 0) || (iVar7 <= (int)uVar9)) goto LAB_009041d1;
        ppvVar3 = p_00->vCis->pArray;
        pDriver = Aig_Or(p_00,(Aig_Obj_t *)((ulong)(uVar1 >> 0x1f) ^ (ulong)ppvVar3[uVar5]),
                         (Aig_Obj_t *)((ulong)(uVar2 >> 0x1f) ^ (ulong)ppvVar3[uVar9]));
        Aig_ObjCreateCo(p_00,pDriver);
      }
      iVar7 = vOneHots->nSize;
      iVar4 = (int)lVar10;
      lVar10 = lVar10 + 2;
    } while (iVar4 + 1 < iVar7);
  }
  Aig_ManCleanup(p_00);
  return p_00;
}

Assistant:

Aig_Man_t * Fra_OneHotCreateExdc( Fra_Man_t * p, Vec_Int_t * vOneHots )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj1, * pObj2, * pObj;
    int i, Out1, Out2, nTruePis;
    pNew = Aig_ManStart( Vec_IntSize(vOneHots)/2 );
//    for ( i = 0; i < Aig_ManRegNum(p->pManAig); i++ )
//        Aig_ObjCreateCi(pNew);
    Aig_ManForEachCi( p->pManAig, pObj, i )
        Aig_ObjCreateCi(pNew);
    nTruePis = Aig_ManCiNum(p->pManAig) - Aig_ManRegNum(p->pManAig);
    for ( i = 0; i < Vec_IntSize(vOneHots); i += 2 )
    {
        Out1 = Vec_IntEntry( vOneHots, i );
        Out2 = Vec_IntEntry( vOneHots, i+1 );
        if ( Out1 == 0 && Out2 == 0 )
            continue;
        pObj1 = Aig_ManCi( pNew, nTruePis + Fra_LitReg(Out1) );
        pObj2 = Aig_ManCi( pNew, nTruePis + Fra_LitReg(Out2) );
        pObj1 = Aig_NotCond( pObj1, Fra_LitSign(Out1) );
        pObj2 = Aig_NotCond( pObj2, Fra_LitSign(Out2) );
        pObj  = Aig_Or( pNew, pObj1, pObj2 );
        Aig_ObjCreateCo( pNew, pObj );
    }
    Aig_ManCleanup(pNew);
//    printf( "Created AIG with %d nodes and %d outputs.\n", Aig_ManNodeNum(pNew), Aig_ManCoNum(pNew) );
    return pNew;
}